

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.cpp
# Opt level: O3

int mbedtls_md_hmac_reset(mbedtls_md_context_t *ctx)

{
  uchar *input;
  int iVar1;
  
  iVar1 = -0x5100;
  if (((ctx != (mbedtls_md_context_t *)0x0) && (ctx->md_info != (mbedtls_md_info_t *)0x0)) &&
     (input = (uchar *)ctx->hmac_ctx, input != (uchar *)0x0)) {
    iVar1 = mbedtls_md_starts(ctx);
    if (iVar1 == 0) {
      iVar1 = mbedtls_md_update(ctx,input,(ulong)ctx->md_info->block_size);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_md_hmac_reset(mbedtls_md_context_t *ctx)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char *ipad;

    if (ctx == NULL || ctx->md_info == NULL || ctx->hmac_ctx == NULL) {
        return MBEDTLS_ERR_MD_BAD_INPUT_DATA;
    }

    ipad = (unsigned char *) ctx->hmac_ctx;

    if ((ret = mbedtls_md_starts(ctx)) != 0) {
        return ret;
    }
    return mbedtls_md_update(ctx, ipad, ctx->md_info->block_size);
}